

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O3

Test * __thiscall ObjTable<Test>::emplace_back_large<int&>(ObjTable<Test> *this,int *args)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  iterator __position;
  size_t sVar3;
  Test *pTVar4;
  
  __position._M_node = (this->sparse_elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->sparse_elements)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      iVar2._M_current =
           (this->super_vector<Test,_std::allocator<Test>_>).
           super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_finish
      ;
      if (*(long *)(__position._M_node + 1) !=
          (long)iVar2._M_current -
          (long)(this->super_vector<Test,_std::allocator<Test>_>).
                super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
                _M_start >> 2) break;
      if (iVar2._M_current ==
          (this->super_vector<Test,_std::allocator<Test>_>).
          super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<Test,_std::allocator<Test>_>::_M_realloc_insert<Test>
                  (&this->super_vector<Test,_std::allocator<Test>_>,iVar2,
                   (Test *)&__position._M_node[1]._M_parent);
      }
      else {
        (iVar2._M_current)->value = *(int *)&__position._M_node[1]._M_parent;
        (this->super_vector<Test,_std::allocator<Test>_>).
        super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar2._M_current + 1;
      }
      __position = std::
                   _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Test>,std::_Select1st<std::pair<unsigned_long_const,Test>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Test>>>
                   ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Test>,std::_Select1st<std::pair<unsigned_long_const,Test>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Test>>>
                                       *)&this->sparse_elements,__position);
    } while ((_Rb_tree_header *)__position._M_node != p_Var1);
  }
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    sVar3 = *(size_t *)(__position._M_node + 1);
  }
  this->min_sparse = sVar3;
  iVar2._M_current =
       (this->super_vector<Test,_std::allocator<Test>_>).
       super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->super_vector<Test,_std::allocator<Test>_>).
      super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Test,std::allocator<Test>>::_M_realloc_insert<int&>
              ((vector<Test,std::allocator<Test>> *)this,iVar2,args);
    pTVar4 = (this->super_vector<Test,_std::allocator<Test>_>).
             super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  }
  else {
    (iVar2._M_current)->value = *args;
    pTVar4 = iVar2._M_current + 1;
    (this->super_vector<Test,_std::allocator<Test>_>).
    super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data._M_finish =
         pTVar4;
  }
  return pTVar4 + -1;
}

Assistant:

T&
    emplace_back_large(Args&&... args)
    {
        auto it = sparse_elements.begin();
        auto end = sparse_elements.end();
        while (it != end && it->first == std::vector<T>::size()) {
            std::vector<T>::emplace_back(std::move(it->second));
            it = sparse_elements.erase(it);
        }
        min_sparse = (it == end) ? std::numeric_limits<size_t>::max() : it->first;
        return std::vector<T>::emplace_back(std::forward<Args&&...>(args...));
    }